

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O1

void ptls_asn1_dump_content
               (uint8_t *bytes,size_t bytes_max,size_t byte_index,ptls_minicrypto_log_ctx_t *log_ctx
               )

{
  undefined8 extraout_RDX;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = bytes_max - byte_index;
  if ((byte_index <= bytes_max && uVar3 != 0) && log_ctx != (ptls_minicrypto_log_ctx_t *)0x0) {
    (*log_ctx->fn)(log_ctx->ctx," ");
    uVar2 = 0x10;
    if (uVar3 < 0x10) {
      uVar2 = uVar3;
    }
    lVar1 = 0;
    do {
      (*log_ctx->fn)(log_ctx->ctx,"%02x",(ulong)bytes[lVar1 + byte_index]);
      lVar1 = lVar1 + 1;
    } while (uVar2 + (uVar2 == 0) != lVar1);
    if (0x10 < uVar3) {
      (*log_ctx->fn)(log_ctx->ctx,"...",extraout_RDX,log_ctx->fn);
      return;
    }
  }
  return;
}

Assistant:

void ptls_asn1_dump_content(const uint8_t *bytes, size_t bytes_max, size_t byte_index, ptls_minicrypto_log_ctx_t *log_ctx)
{
    if (log_ctx != NULL && bytes_max > byte_index) {
        size_t nb_bytes = bytes_max - byte_index;

        log_ctx->fn(log_ctx->ctx, " ");

        for (size_t i = 0; i < 16 && i < nb_bytes; i++) {
            log_ctx->fn(log_ctx->ctx, "%02x", bytes[byte_index + i]);
        }

        if (nb_bytes > 16) {
            log_ctx->fn(log_ctx->ctx, "...");
        }
    }
}